

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_allocator.cpp
# Opt level: O0

allocation_slot __thiscall
libtorrent::aux::stack_allocator::copy_string(stack_allocator *this,char *str)

{
  int idx;
  int v;
  size_type sVar1;
  size_t sVar2;
  value_type *pvVar3;
  unsigned_long __n;
  int len;
  int ret;
  char *str_local;
  stack_allocator *this_local;
  
  sVar1 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)this);
  idx = (int)sVar1;
  sVar2 = strlen(str);
  v = (int)sVar2;
  container_wrapper<char,int,std::vector<char,std::allocator<char>>>::resize<int,void>
            ((container_wrapper<char,int,std::vector<char,std::allocator<char>>> *)this,idx + v + 1)
  ;
  pvVar3 = container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>::operator[]
                     (&this->m_storage,idx);
  __n = numeric_cast<unsigned_long,int,void>(v);
  memcpy(pvVar3,str,__n);
  pvVar3 = container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>::operator[]
                     (&this->m_storage,idx + v);
  *pvVar3 = '\0';
  allocation_slot::allocation_slot((allocation_slot *)((long)&this_local + 4),idx);
  return (allocation_slot)this_local._4_4_;
}

Assistant:

allocation_slot stack_allocator::copy_string(char const* str)
	{
		int const ret = int(m_storage.size());
		int const len = int(std::strlen(str));
		m_storage.resize(ret + len + 1);
		std::memcpy(&m_storage[ret], str, numeric_cast<std::size_t>(len));
		m_storage[ret + len] = '\0';
		return allocation_slot(ret);
	}